

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint __thiscall ON_MeshComponentRef::VertexIndex(ON_MeshComponentRef *this)

{
  TYPE TVar1;
  uint uVar2;
  uint uVar3;
  ON_MeshTopologyVertex *pOVar4;
  ON_MeshTopologyVertex *v;
  uint vi;
  ON_MeshComponentRef *this_local;
  
  v._4_4_ = 0xffffffff;
  if ((this->m_mesh != (ON_Mesh *)0x0) && (-1 < (this->m_mesh_ci).m_index)) {
    TVar1 = (this->m_mesh_ci).m_type;
    if (TVar1 == mesh_vertex) {
      uVar2 = (this->m_mesh_ci).m_index;
      uVar3 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                        (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
      if (uVar2 < uVar3) {
        v._4_4_ = (this->m_mesh_ci).m_index;
      }
    }
    else if ((((TVar1 == meshtop_vertex) &&
              (pOVar4 = MeshTopologyVertex(this), pOVar4 != (ON_MeshTopologyVertex *)0x0)) &&
             (pOVar4->m_v_count == 1)) &&
            ((pOVar4->m_vi != (int *)0x0 &&
             (uVar2 = *pOVar4->m_vi,
             uVar3 = ON_SimpleArray<ON_3fPoint>::UnsignedCount
                               (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>),
             uVar2 < uVar3)))) {
      v._4_4_ = *pOVar4->m_vi;
    }
  }
  return v._4_4_;
}

Assistant:

unsigned int ON_MeshComponentRef::VertexIndex() const
{
  unsigned int vi = ON_UNSET_UINT_INDEX;
  if ( 0 != m_mesh && m_mesh_ci.m_index >= 0 )
  {
    switch(m_mesh_ci.m_type)
    {
    case ON_COMPONENT_INDEX::meshtop_vertex:
      {
        const struct ON_MeshTopologyVertex* v = MeshTopologyVertex();
        if ( 0 != v && 1 == v->m_v_count && 0 != v->m_vi 
             && ((unsigned int)v->m_vi[0]) < m_mesh->m_V.UnsignedCount()
           )
        {
          vi = (unsigned int)v->m_vi[0];
        }
      }
      break;

    case ON_COMPONENT_INDEX::mesh_vertex:
      if ( ((unsigned int)m_mesh_ci.m_index) < m_mesh->m_V.UnsignedCount() )
        vi = (unsigned int)m_mesh_ci.m_index;
      break;
    
    default:
      break;
    }
  }
  return vi;
}